

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldCex.c
# Opt level: O2

Aig_Man_t *
Saig_ManCbaUnrollWithCex
          (Aig_Man_t *pAig,Abc_Cex_t *pCex,int nInputs,Vec_Int_t **pvMapPiF2A,
          Vec_Vec_t **pvReg2Frame)

{
  anon_union_8_3_a781e0d5_for_Aig_Obj_t__13 aVar1;
  Vec_Vec_t *p;
  int iVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *pVVar5;
  Vec_Vec_t *p_00;
  Vec_Vec_t *p_01;
  Aig_Obj_t *pAVar6;
  Vec_Int_t *pVVar7;
  Vec_Ptr_t *pVVar8;
  Aig_Man_t *p_02;
  char *pcVar9;
  void *pvVar10;
  Aig_Obj_t *pAVar11;
  Aig_Obj_t *p1;
  uint uVar12;
  int iVar13;
  int iVar14;
  
  if (pAig->nTruePis != pCex->nPis) {
    __assert_fail("Saig_ManPiNum(pAig) == pCex->nPis",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldCex.c"
                  ,0x198,
                  "Aig_Man_t *Saig_ManCbaUnrollWithCex(Aig_Man_t *, Abc_Cex_t *, int, Vec_Int_t **, Vec_Vec_t **)"
                 );
  }
  if ((pCex->iPo < 0) || (pAig->nTruePos <= pCex->iPo)) {
    __assert_fail("pCex->iPo >= 0 && pCex->iPo < Saig_ManPoNum(pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldCex.c"
                  ,0x19a,
                  "Aig_Man_t *Saig_ManCbaUnrollWithCex(Aig_Man_t *, Abc_Cex_t *, int, Vec_Int_t **, Vec_Vec_t **)"
                 );
  }
  pVVar5 = Vec_IntAlloc(1000);
  *pvMapPiF2A = pVVar5;
  p_00 = Vec_VecStart(pCex->iFrame + 1);
  p_01 = Vec_VecStart(pCex->iFrame + 1);
  pAVar6 = Aig_ManCo(pAig,pCex->iPo);
  Vec_VecPushInt(p_00,pCex->iFrame,pAVar6->Id);
  iVar2 = pCex->iFrame;
  while (iVar14 = iVar2, -1 < iVar14) {
    Aig_ManIncrementTravId(pAig);
    pVVar5 = Vec_VecEntryInt(p_00,iVar14);
    for (iVar13 = 0; iVar2 = iVar14 + -1, iVar13 < pVVar5->nSize; iVar13 = iVar13 + 1) {
      iVar2 = Vec_IntEntry(pVVar5,iVar13);
      pAVar6 = Aig_ManObj(pAig,iVar2);
      pVVar7 = Vec_VecEntryInt(p_01,iVar14);
      if (iVar14 == 0) {
        pVVar8 = (Vec_Ptr_t *)0x0;
      }
      else {
        pVVar8 = Vec_VecEntry(p_00,iVar14 + -1);
      }
      Saig_ManCbaUnrollCollect_rec(pAig,pAVar6,pVVar7,(Vec_Int_t *)pVVar8);
    }
  }
  p_02 = Aig_ManStart(10000);
  pcVar9 = Abc_UtilStrsav(pAig->pName);
  p_02->pName = pcVar9;
  pcVar9 = Abc_UtilStrsav(pAig->pSpec);
  p_02->pSpec = pcVar9;
  iVar2 = pAig->nRegs;
  if (iVar2 == pCex->nRegs) {
    for (uVar12 = 0; (int)uVar12 < iVar2; uVar12 = uVar12 + 1) {
      pvVar10 = Vec_PtrEntry(pAig->vCis,pAig->nTruePis + uVar12);
      *(ulong *)((long)pvVar10 + 0x28) =
           (ulong)(((uint)(&pCex[1].iPo)[uVar12 >> 5] >> (uVar12 & 0x1f) & 1) == 0) ^
           (ulong)p_02->pConst1;
      iVar2 = pAig->nRegs;
    }
  }
  else {
    for (iVar14 = 0; iVar14 < iVar2; iVar14 = iVar14 + 1) {
      pvVar10 = Vec_PtrEntry(pAig->vCis,pAig->nTruePis + iVar14);
      *(ulong *)((long)pvVar10 + 0x28) = (ulong)p_02->pConst1 ^ 1;
      iVar2 = pAig->nRegs;
    }
  }
  for (iVar2 = 0; iVar2 <= pCex->iFrame; iVar2 = iVar2 + 1) {
    pVVar5 = Vec_VecEntryInt(p_01,iVar2);
    for (iVar14 = 0; iVar14 < pVVar5->nSize; iVar14 = iVar14 + 1) {
      iVar13 = Vec_IntEntry(pVVar5,iVar14);
      pAVar6 = Aig_ManObj(pAig,iVar13);
      uVar12 = (uint)*(undefined8 *)&pAVar6->field_0x18;
      if ((uVar12 & 7) - 7 < 0xfffffffe) {
        if ((uVar12 & 7) == 3) {
          pAVar11 = Aig_ObjChild0Copy(pAVar6);
          goto LAB_004f2217;
        }
        iVar13 = Aig_ObjIsConst1(pAVar6);
        if (iVar13 != 0) {
          pAVar11 = p_02->pConst1;
          goto LAB_004f2217;
        }
        if (((*(uint *)&pAVar6->field_0x18 & 7) == 2) &&
           (iVar13 = Aig_ObjCioId(pAVar6), iVar13 < pAig->nTruePis)) {
          iVar13 = Aig_ObjCioId(pAVar6);
          if (iVar13 < nInputs) {
            iVar13 = pCex->nPis;
            iVar4 = pCex->nRegs;
            iVar3 = Aig_ObjCioId(pAVar6);
            uVar12 = iVar3 + iVar13 * iVar2 + iVar4;
            (pAVar6->field_5).pData =
                 (void *)((ulong)(((uint)(&pCex[1].iPo)[(int)uVar12 >> 5] >> (uVar12 & 0x1f) & 1) ==
                                 0) ^ (ulong)p_02->pConst1);
          }
          else {
            pAVar11 = Aig_ObjCreateCi(p_02);
            (pAVar6->field_5).pData = pAVar11;
            pVVar7 = *pvMapPiF2A;
            iVar13 = Aig_ObjCioId(pAVar6);
            Vec_IntPush(pVVar7,iVar13);
            Vec_IntPush(*pvMapPiF2A,iVar2);
          }
        }
      }
      else {
        pAVar11 = Aig_ObjChild0Copy(pAVar6);
        p1 = Aig_ObjChild1Copy(pAVar6);
        pAVar11 = Aig_And(p_02,pAVar11,p1);
LAB_004f2217:
        (pAVar6->field_5).pData = pAVar11;
      }
    }
    if (iVar2 == pCex->iFrame) break;
    pVVar5 = Vec_VecEntryInt(p_00,iVar2);
    for (iVar14 = 0; iVar14 < pVVar5->nSize; iVar14 = iVar14 + 1) {
      iVar13 = Vec_IntEntry(pVVar5,iVar14);
      pAVar6 = Aig_ManObj(pAig,iVar13);
      aVar1 = pAVar6->field_5;
      iVar13 = Saig_ObjIsLi(pAig,pAVar6);
      if (iVar13 == 0) {
        __assert_fail("Saig_ObjIsLi(p, pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saig.h"
                      ,0x57,"Aig_Obj_t *Saig_ObjLiToLo(Aig_Man_t *, Aig_Obj_t *)");
      }
      pVVar8 = pAig->vCis;
      iVar13 = pAig->nTruePis;
      iVar4 = Aig_ObjCioId(pAVar6);
      pvVar10 = Vec_PtrEntry(pVVar8,(iVar13 + iVar4) - pAig->nTruePos);
      *(anon_union_8_3_a781e0d5_for_Aig_Obj_t__13 *)((long)pvVar10 + 0x28) = aVar1;
      if (*pvReg2Frame != (Vec_Vec_t *)0x0) {
        Vec_VecPushInt(*pvReg2Frame,iVar2,pAVar6->Id);
        p = *pvReg2Frame;
        iVar13 = Abc_Var2Lit(*(int *)(((ulong)(pAVar6->field_5).pData & 0xfffffffffffffffe) + 0x24),
                             (pAVar6->field_5).iData & 1);
        Vec_VecPushInt(p,iVar2,iVar13);
      }
    }
  }
  pAVar6 = Aig_ManCo(pAig,pCex->iPo);
  Aig_ObjCreateCo(p_02,(Aig_Obj_t *)((ulong)(pAVar6->field_5).pData ^ 1));
  Aig_ManSetRegNum(p_02,0);
  Vec_VecFree(p_00);
  Vec_VecFree(p_01);
  Aig_ManCleanup(p_02);
  return p_02;
}

Assistant:

Aig_Man_t * Saig_ManCbaUnrollWithCex( Aig_Man_t * pAig, Abc_Cex_t * pCex, int nInputs, Vec_Int_t ** pvMapPiF2A, Vec_Vec_t ** pvReg2Frame )
{
    Aig_Man_t * pFrames;     // unrolled timeframes
    Vec_Vec_t * vFrameCos;   // the list of COs per frame
    Vec_Vec_t * vFrameObjs;  // the list of objects per frame
    Vec_Int_t * vRoots, * vObjs;
    Aig_Obj_t * pObj;
    int i, f;
    // sanity checks
    assert( Saig_ManPiNum(pAig) == pCex->nPis );
//    assert( Saig_ManRegNum(pAig) == pCex->nRegs );
    assert( pCex->iPo >= 0 && pCex->iPo < Saig_ManPoNum(pAig) );

    // map PIs of the unrolled frames into PIs of the original design
    *pvMapPiF2A = Vec_IntAlloc( 1000 );

    // collect COs and Objs visited in each frame
    vFrameCos  = Vec_VecStart( pCex->iFrame+1 );
    vFrameObjs = Vec_VecStart( pCex->iFrame+1 );
    // initialized the topmost frame
    pObj = Aig_ManCo( pAig, pCex->iPo );
    Vec_VecPushInt( vFrameCos, pCex->iFrame, Aig_ObjId(pObj) );
    for ( f = pCex->iFrame; f >= 0; f-- )
    {
        // collect nodes starting from the roots
        Aig_ManIncrementTravId( pAig );
        vRoots = Vec_VecEntryInt( vFrameCos, f );
        Aig_ManForEachObjVec( vRoots, pAig, pObj, i )
            Saig_ManCbaUnrollCollect_rec( pAig, pObj, 
                Vec_VecEntryInt(vFrameObjs, f),
                (Vec_Int_t *)(f ? Vec_VecEntry(vFrameCos, f-1) : NULL) );
    }

    // derive unrolled timeframes
    pFrames = Aig_ManStart( 10000 );
    pFrames->pName = Abc_UtilStrsav( pAig->pName );
    pFrames->pSpec = Abc_UtilStrsav( pAig->pSpec );
    // initialize the flops 
    if ( Saig_ManRegNum(pAig) == pCex->nRegs )
    {
        Saig_ManForEachLo( pAig, pObj, i )
            pObj->pData = Aig_NotCond( Aig_ManConst1(pFrames), !Abc_InfoHasBit(pCex->pData, i) );
    }
    else // this is the case when synthesis was applied, assume all-0 init state
    {
        Saig_ManForEachLo( pAig, pObj, i )
            pObj->pData = Aig_NotCond( Aig_ManConst1(pFrames), 1 );
    }
    // iterate through the frames
    for ( f = 0; f <= pCex->iFrame; f++ )
    {
        // construct
        vObjs = Vec_VecEntryInt( vFrameObjs, f );
        Aig_ManForEachObjVec( vObjs, pAig, pObj, i )
        {
            if ( Aig_ObjIsNode(pObj) )
                pObj->pData = Aig_And( pFrames, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
            else if ( Aig_ObjIsCo(pObj) )
                pObj->pData = Aig_ObjChild0Copy(pObj);
            else if ( Aig_ObjIsConst1(pObj) )
                pObj->pData = Aig_ManConst1(pFrames);
            else if ( Saig_ObjIsPi(pAig, pObj) )
            {
                if ( Aig_ObjCioId(pObj) < nInputs )
                {
                    int iBit = pCex->nRegs + f * pCex->nPis + Aig_ObjCioId(pObj);
                    pObj->pData = Aig_NotCond( Aig_ManConst1(pFrames), !Abc_InfoHasBit(pCex->pData, iBit) );
                }
                else
                {
                    pObj->pData = Aig_ObjCreateCi( pFrames );
                    Vec_IntPush( *pvMapPiF2A, Aig_ObjCioId(pObj) );
                    Vec_IntPush( *pvMapPiF2A, f );
                }
            }
        }
        if ( f == pCex->iFrame )
            break;
        // transfer
        vRoots = Vec_VecEntryInt( vFrameCos, f );
        Aig_ManForEachObjVec( vRoots, pAig, pObj, i )
        {
            Saig_ObjLiToLo( pAig, pObj )->pData = pObj->pData;
            if ( *pvReg2Frame )
            {
                Vec_VecPushInt( *pvReg2Frame, f, Aig_ObjId(pObj) );             // record LO
                Vec_VecPushInt( *pvReg2Frame, f, Aig_ObjToLit((Aig_Obj_t *)pObj->pData) ); // record its literal
            }
        }
    }
    // create output
    pObj = Aig_ManCo( pAig, pCex->iPo );
    Aig_ObjCreateCo( pFrames, Aig_Not((Aig_Obj_t *)pObj->pData) );
    Aig_ManSetRegNum( pFrames, 0 );
    // cleanup
    Vec_VecFree( vFrameCos );
    Vec_VecFree( vFrameObjs );
    // finallize
    Aig_ManCleanup( pFrames );
    // return
    return pFrames;
}